

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O0

void __thiscall
CVmObjVector::remove_elements_undo
          (CVmObjVector *this,vm_obj_id_t self,size_t start_idx,size_t del_cnt)

{
  CVmObjVector *pCVar1;
  long in_RCX;
  CVmObjVector *in_RDX;
  CVmObjVector *in_RDI;
  vm_val_t val;
  size_t move_idx;
  size_t idx;
  size_t cnt;
  size_t in_stack_ffffffffffffffa8;
  vm_val_t *in_stack_ffffffffffffffb8;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffffc0;
  vm_obj_id_t self_00;
  CVmObjVector *pCVar2;
  
  pCVar1 = (CVmObjVector *)get_element_count((CVmObjVector *)0x3a4116);
  for (; in_RDX < pCVar1;
      in_RDX = (CVmObjVector *)
               ((long)&(in_RDX->super_CVmObjCollection).super_CVmObject._vptr_CVmObject + 1)) {
    pCVar2 = (CVmObjVector *)
             ((long)&(in_RDX->super_CVmObjCollection).super_CVmObject._vptr_CVmObject + in_RCX);
    if (pCVar2 < pCVar1) {
      get_element(in_RDI,in_stack_ffffffffffffffa8,(vm_val_t *)0x3a4160);
      self_00 = (vm_obj_id_t)((ulong)pCVar2 >> 0x20);
    }
    else {
      vm_val_t::set_nil((vm_val_t *)&stack0xffffffffffffffb8);
      self_00 = (vm_obj_id_t)((ulong)pCVar2 >> 0x20);
    }
    set_element_undo(in_RDX,self_00,(size_t)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  set_element_count_undo((CVmObjVector *)cnt,idx._4_4_,move_idx);
  return;
}

Assistant:

void CVmObjVector::remove_elements_undo(VMG_ vm_obj_id_t self,
                                        size_t start_idx, size_t del_cnt)
{
    /* note the original size of the vector */
    size_t cnt = get_element_count();

    /* move all of the elements to their new slots, keeping undo */
    for (size_t idx = start_idx ; idx < cnt ; ++idx)
    {
        /* 
         *   calculate the index of the element to replace this one - it's
         *   past us by the number of items being deleted 
         */
        size_t move_idx = idx + del_cnt;

        /* 
         *   if we're moving from a valid index in the old vector, get the
         *   element; otherwise, replace the value with nil (but still
         *   replace the value, since we want to keep undo for its original
         *   value) 
         */
        vm_val_t val;
        if (move_idx < cnt)
            get_element(move_idx, &val);
        else
            val.set_nil();

        /* store the element at its new position */
        set_element_undo(vmg_ self, idx, &val);
    }

    /*
     *   Reduce the size, keeping undo.  Note that it's important we do
     *   this last: undo is applied in reverse order, so when applying
     *   undo, we first want to increase the vector's size to its original
     *   size, then we want to apply the element value restorations.
     */
    set_element_count_undo(vmg_ self, cnt - del_cnt);
}